

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir_nav_extensions.cpp
# Opt level: O3

bool dlib::file_exists(string *filename)

{
  file temp;
  file local_50;
  
  file::file(&local_50,filename);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.state.full_name._M_dataplus._M_p != &local_50.state.full_name.field_2) {
    operator_delete(local_50.state.full_name._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50.state.name._M_dataplus._M_p != &local_50.state.name.field_2) {
    operator_delete(local_50.state.name._M_dataplus._M_p);
  }
  return true;
}

Assistant:

bool file_exists (
        const std::string& filename
    )
    {
        try
        {
            dlib::file temp(filename);
            return true;
        }
        catch (file::file_not_found&)
        {
            return false;
        }
    }